

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O0

REF_STATUS ref_part_scalar_solb(REF_NODE ref_node,REF_INT *ldim,REF_DBL **scalar,char *filename)

{
  REF_FILEPOS RVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  void *pvVar5;
  __off_t _Var6;
  int local_62c;
  int local_628;
  int local_620;
  REF_LONG ref_private_status_reis_bi_5;
  REF_LONG ref_private_status_reis_ai_5;
  REF_LONG ref_private_status_reis_bi_4;
  REF_LONG ref_private_status_reis_ai_4;
  REF_STATUS ref_private_macro_code_rxs_1;
  REF_STATUS ref_private_macro_code_rxs;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_LONG ref_private_status_reis_bi_3;
  REF_LONG ref_private_status_reis_ai_3;
  REF_INT ref_malloc_init_i;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_LONG ref_private_status_reis_bi_2;
  REF_LONG ref_private_status_reis_ai_2;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_LONG nnode_read;
  REF_LONG nnode;
  REF_INT i;
  REF_INT type;
  REF_INT ntype;
  REF_INT dim;
  REF_INT version;
  REF_BOOL available;
  REF_INT local;
  REF_INT node;
  REF_GLOB global;
  void *pvStack_540;
  REF_INT section_size;
  REF_DBL *data;
  FILE *pFStack_530;
  REF_INT chunk;
  FILE *file;
  REF_FILEPOS key_pos [156];
  REF_FILEPOS local_40;
  REF_FILEPOS next_position;
  REF_MPI ref_mpi;
  char *filename_local;
  REF_DBL **scalar_local;
  REF_INT *ldim_local;
  REF_NODE ref_node_local;
  
  next_position = (REF_FILEPOS)ref_node->ref_mpi;
  local_40 = -1;
  pFStack_530 = (FILE *)0x0;
  ref_mpi = (REF_MPI)filename;
  filename_local = (char *)scalar;
  scalar_local = (REF_DBL **)ldim;
  ldim_local = &ref_node->n;
  if (ref_node->ref_mpi->id == 0) {
    uVar2 = ref_import_meshb_header(filename,&ntype,(REF_FILEPOS *)&file);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0xba7,
             "ref_part_scalar_solb",(ulong)uVar2,"head");
      return uVar2;
    }
    if ((ntype < 2) || (4 < ntype)) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0xba8,
             "ref_part_scalar_solb","unsupported version");
      return 1;
    }
    pFStack_530 = fopen((char *)ref_mpi,"r");
    if (pFStack_530 == (FILE *)0x0) {
      printf("unable to open %s\n",ref_mpi);
    }
    if (pFStack_530 == (FILE *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0xbab,
             "ref_part_scalar_solb","unable to open file");
      return 2;
    }
    uVar2 = ref_import_meshb_jump((FILE *)pFStack_530,ntype,(REF_FILEPOS *)&file,3,&dim,&local_40);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0xbae,
             "ref_part_scalar_solb",(ulong)uVar2,"jump");
      return uVar2;
    }
    if (dim == 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0xbaf,
             "ref_part_scalar_solb","solb missing dimension");
      return 1;
    }
    sVar4 = fread(&type,4,1,pFStack_530);
    if (sVar4 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0xbb0,
             "ref_part_scalar_solb","dim",1,sVar4);
      return 1;
    }
    if ((type < 2) || (3 < type)) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0xbb1,
             "ref_part_scalar_solb","unsupported dimension");
      return 1;
    }
    uVar2 = ref_import_meshb_jump
                      ((FILE *)pFStack_530,ntype,(REF_FILEPOS *)&file,0x3e,&dim,&local_40);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0xbb5,
             "ref_part_scalar_solb",(ulong)uVar2,"jmp");
      return uVar2;
    }
    if (dim == 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0xbb6,
             "ref_part_scalar_solb","SolAtVertices missing");
      return 1;
    }
    uVar2 = ref_part_meshb_long((FILE *)pFStack_530,ntype,&nnode_read);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",2999,
             "ref_part_scalar_solb",(ulong)uVar2,"nnode");
      return uVar2;
    }
    sVar4 = fread(&i,4,1,pFStack_530);
    if (sVar4 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",3000,
             "ref_part_scalar_solb","ntype",1,sVar4);
      return 1;
    }
    *(undefined4 *)scalar_local = 0;
    for (nnode._0_4_ = 0; (int)nnode < i; nnode._0_4_ = (int)nnode + 1) {
      sVar4 = fread((void *)((long)&nnode + 4),4,1,pFStack_530);
      if (sVar4 != 1) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0xbbb,"ref_part_scalar_solb","type",1,sVar4);
        return 1;
      }
      if (((int)nnode._4_4_ < 1) || (2 < (int)nnode._4_4_)) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0xbbe,"ref_part_scalar_solb","only types 1 (scalar) or 2 (vector) supported");
        printf(" %d type\n",(ulong)nnode._4_4_);
        return 1;
      }
      if (nnode._4_4_ == 1) {
        *(int *)scalar_local = *(int *)scalar_local + 1;
      }
      if (nnode._4_4_ == 2) {
        *(REF_INT *)scalar_local = type + *(int *)scalar_local;
      }
    }
  }
  uVar2 = ref_mpi_bcast(*(REF_MPI *)(ldim_local + 0x14),&ntype,1,1);
  if (uVar2 == 0) {
    uVar2 = ref_mpi_bcast(*(REF_MPI *)(ldim_local + 0x14),&type,1,1);
    if (uVar2 == 0) {
      uVar2 = ref_mpi_bcast(*(REF_MPI *)(ldim_local + 0x14),&nnode_read,1,2);
      if (uVar2 == 0) {
        uVar2 = ref_mpi_bcast(*(REF_MPI *)(ldim_local + 0x14),scalar_local,1,1);
        if (uVar2 == 0) {
          if ((nnode_read != *(long *)(ldim_local + 0x1a)) &&
             (nnode_read / 2 != *(long *)(ldim_local + 0x1a))) {
            if (*(int *)(next_position + 4) == 0) {
              printf("file %ld ref_node %ld %s\n",nnode_read,*(undefined8 *)(ldim_local + 0x1a),
                     ref_mpi);
            }
            if (nnode_read <= *(long *)(ldim_local + 0x1a)) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0xbd5,"ref_part_scalar_solb","ERROR: global count mismatch, too few");
              return 1;
            }
            if (*(int *)(next_position + 4) == 0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0xbd3,"ref_part_scalar_solb","WARNING: global count mismatch, too many");
            }
          }
          if (*(int *)scalar_local * ldim_local[1] < 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0xbd9,"ref_part_scalar_solb","malloc *scalar of REF_DBL negative");
            ref_node_local._4_4_ = 1;
          }
          else {
            pvVar5 = malloc((long)(*(int *)scalar_local * ldim_local[1]) << 3);
            *(void **)filename_local = pvVar5;
            if (*(long *)filename_local == 0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0xbd9,"ref_part_scalar_solb","malloc *scalar of REF_DBL NULL");
              ref_node_local._4_4_ = 2;
            }
            else {
              if (nnode_read / (long)**(int **)(ldim_local + 0x14) < 100000) {
                local_620 = 100000;
              }
              else {
                local_620 = (int)(nnode_read / (long)**(int **)(ldim_local + 0x14));
              }
              if (local_620 < nnode_read) {
                local_628 = local_620;
              }
              else {
                local_628 = (int)nnode_read;
              }
              data._4_4_ = local_628;
              if (*(int *)scalar_local * local_628 < 0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0xbdf,"ref_part_scalar_solb","malloc data of REF_DBL negative");
                ref_node_local._4_4_ = 1;
              }
              else {
                pvStack_540 = malloc((long)(*(int *)scalar_local * local_628) << 3);
                if (pvStack_540 == (void *)0x0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0xbdf,"ref_part_scalar_solb","malloc data of REF_DBL NULL");
                  ref_node_local._4_4_ = 2;
                }
                else {
                  for (ref_private_status_reis_ai_3._4_4_ = 0;
                      ref_private_status_reis_ai_3._4_4_ < *(int *)scalar_local * data._4_4_;
                      ref_private_status_reis_ai_3._4_4_ = ref_private_status_reis_ai_3._4_4_ + 1) {
                    *(undefined8 *)
                     ((long)pvStack_540 + (long)ref_private_status_reis_ai_3._4_4_ * 8) =
                         0xbff0000000000000;
                  }
                  for (_ref_private_macro_code_rss_1 = 0; _ref_private_macro_code_rss_1 < nnode_read
                      ; _ref_private_macro_code_rss_1 = global._4_4_ + _ref_private_macro_code_rss_1
                      ) {
                    if (data._4_4_ < (int)nnode_read - (int)_ref_private_macro_code_rss_1) {
                      local_62c = data._4_4_;
                    }
                    else {
                      local_62c = (int)nnode_read - (int)_ref_private_macro_code_rss_1;
                    }
                    global._4_4_ = local_62c;
                    if (*(int *)(*(long *)(ldim_local + 0x14) + 4) == 0) {
                      iVar3 = *(int *)scalar_local;
                      sVar4 = fread(pvStack_540,8,(long)(*(int *)scalar_local * local_62c),
                                    pFStack_530);
                      if ((long)(iVar3 * local_62c) != sVar4) {
                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                               ,0xbe7,"ref_part_scalar_solb","dat",(long)(iVar3 * local_62c),sVar4);
                        return 1;
                      }
                      uVar2 = ref_mpi_bcast(*(REF_MPI *)(ldim_local + 0x14),pvStack_540,
                                            *(int *)scalar_local * data._4_4_,3);
                      if (uVar2 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                               ,0xbea,"ref_part_scalar_solb",(ulong)uVar2,"bcast");
                        return uVar2;
                      }
                    }
                    else {
                      uVar2 = ref_mpi_bcast(*(REF_MPI *)(ldim_local + 0x14),pvStack_540,
                                            *(int *)scalar_local * data._4_4_,3);
                      if (uVar2 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                               ,0xbee,"ref_part_scalar_solb",(ulong)uVar2,"bcast");
                        return uVar2;
                      }
                    }
                    for (available = 0; available < global._4_4_; available = available + 1) {
                      _local = available + _ref_private_macro_code_rss_1;
                      uVar2 = ::ref_node_local((REF_NODE)ldim_local,_local,&version);
                      if ((uVar2 != 0) && (uVar2 != 5)) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                               ,0xbf2,"ref_part_scalar_solb",(ulong)uVar2,"local");
                        return uVar2;
                      }
                      if (version != -1) {
                        for (nnode._0_4_ = 0; (int)nnode < *(int *)scalar_local;
                            nnode._0_4_ = (int)nnode + 1) {
                          *(undefined8 *)
                           (*(long *)filename_local +
                           (long)((int)nnode + version * *(int *)scalar_local) * 8) =
                               *(undefined8 *)
                                ((long)pvStack_540 +
                                (long)((int)nnode + available * *(int *)scalar_local) * 8);
                        }
                      }
                      if (type == 2) {
                        _local = nnode_read + available + _ref_private_macro_code_rss_1;
                        uVar2 = ::ref_node_local((REF_NODE)ldim_local,_local,&version);
                        if ((uVar2 != 0) && (uVar2 != 5)) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                 ,0xbfa,"ref_part_scalar_solb",(ulong)uVar2,"local");
                          return uVar2;
                        }
                        if (version != -1) {
                          for (nnode._0_4_ = 0; (int)nnode < *(int *)scalar_local;
                              nnode._0_4_ = (int)nnode + 1) {
                            *(undefined8 *)
                             (*(long *)filename_local +
                             (long)((int)nnode + version * *(int *)scalar_local) * 8) =
                                 *(undefined8 *)
                                  ((long)pvStack_540 +
                                  (long)((int)nnode + available * *(int *)scalar_local) * 8);
                          }
                        }
                      }
                    }
                  }
                  if (pvStack_540 != (void *)0x0) {
                    free(pvStack_540);
                  }
                  RVar1 = local_40;
                  if (*(int *)(*(long *)(ldim_local + 0x14) + 4) == 0) {
                    _Var6 = ftello(pFStack_530);
                    if (RVar1 != _Var6) {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0xc08,"ref_part_scalar_solb","end location",RVar1,_Var6);
                      return 1;
                    }
                    iVar3 = fclose(pFStack_530);
                    if ((long)iVar3 != 0) {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0xc09,"ref_part_scalar_solb","close file",0,(long)iVar3);
                      return 1;
                    }
                  }
                  ref_node_local._4_4_ = 0;
                }
              }
            }
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0xbca,"ref_part_scalar_solb",(ulong)uVar2,"bcast ldim");
          ref_node_local._4_4_ = uVar2;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0xbc8,"ref_part_scalar_solb",(ulong)uVar2,"bcast nnode");
        ref_node_local._4_4_ = uVar2;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0xbc6,
             "ref_part_scalar_solb",(ulong)uVar2,"bcast dim");
      ref_node_local._4_4_ = uVar2;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0xbc4,
           "ref_part_scalar_solb",(ulong)uVar2,"bcast version");
    ref_node_local._4_4_ = uVar2;
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_part_scalar_solb(REF_NODE ref_node, REF_INT *ldim,
                                               REF_DBL **scalar,
                                               const char *filename) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_FILEPOS next_position = REF_EMPTY;
  REF_FILEPOS key_pos[REF_IMPORT_MESHB_LAST_KEYWORD];
  FILE *file;
  REF_INT chunk;
  REF_DBL *data;
  REF_INT section_size;
  REF_GLOB global;
  REF_INT node, local;
  REF_BOOL available;
  REF_INT version, dim, ntype, type, i;
  REF_LONG nnode, nnode_read;

  file = NULL;
  if (ref_mpi_once(ref_node_mpi(ref_node))) {
    RSS(ref_import_meshb_header(filename, &version, key_pos), "head");
    RAS(2 <= version && version <= 4, "unsupported version");
    file = fopen(filename, "r");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");
    RSS(ref_import_meshb_jump(file, version, key_pos, 3, &available,
                              &next_position),
        "jump");
    RAS(available, "solb missing dimension");
    REIS(1, fread((unsigned char *)&dim, 4, 1, file), "dim");
    RAS(2 <= dim && dim <= 3, "unsupported dimension");

    RSS(ref_import_meshb_jump(file, version, key_pos, 62, &available,
                              &next_position),
        "jmp");
    RAS(available, "SolAtVertices missing");
    RSS(ref_part_meshb_long(file, version, &nnode), "nnode");
    REIS(1, fread((unsigned char *)&ntype, 4, 1, file), "ntype");
    *ldim = 0;
    for (i = 0; i < ntype; i++) {
      REIS(1, fread((unsigned char *)&type, 4, 1, file), "type");
      RAB(1 <= type && type <= 2,
          "only types 1 (scalar) or 2 (vector) supported",
          { printf(" %d type\n", type); });
      if (1 == type) (*ldim) += 1;
      if (2 == type) (*ldim) += dim;
    }
  }
  RSS(ref_mpi_bcast(ref_node_mpi(ref_node), &version, 1, REF_INT_TYPE),
      "bcast version");
  RSS(ref_mpi_bcast(ref_node_mpi(ref_node), &dim, 1, REF_INT_TYPE),
      "bcast dim");
  RSS(ref_mpi_bcast(ref_node_mpi(ref_node), &nnode, 1, REF_GLOB_TYPE),
      "bcast nnode");
  RSS(ref_mpi_bcast(ref_node_mpi(ref_node), ldim, 1, REF_INT_TYPE),
      "bcast ldim");

  if ((nnode != ref_node_n_global(ref_node)) &&
      (nnode / 2 != ref_node_n_global(ref_node))) {
    if (ref_mpi_once(ref_mpi))
      printf("file %ld ref_node " REF_GLOB_FMT " %s\n", nnode,
             ref_node_n_global(ref_node), filename);
    if (nnode > ref_node_n_global(ref_node)) {
      if (ref_mpi_once(ref_mpi))
        REF_WHERE("WARNING: global count mismatch, too many");
    } else {
      THROW("ERROR: global count mismatch, too few");
    }
  }

  ref_malloc(*scalar, (*ldim) * ref_node_max(ref_node), REF_DBL);

  chunk =
      (REF_INT)MAX(100000, nnode / (REF_LONG)ref_mpi_n(ref_node_mpi(ref_node)));
  chunk = (REF_INT)MIN((REF_LONG)chunk, nnode);

  ref_malloc_init(data, (*ldim) * chunk, REF_DBL, -1.0);

  nnode_read = 0;
  while (nnode_read < nnode) {
    section_size = MIN(chunk, (REF_INT)(nnode - nnode_read));
    if (ref_mpi_once(ref_node_mpi(ref_node))) {
      REIS((*ldim) * section_size,
           fread(data, sizeof(REF_DBL), (size_t)((*ldim) * section_size), file),
           "dat");
      RSS(ref_mpi_bcast(ref_node_mpi(ref_node), data, (*ldim) * chunk,
                        REF_DBL_TYPE),
          "bcast");
    } else {
      RSS(ref_mpi_bcast(ref_node_mpi(ref_node), data, (*ldim) * chunk,
                        REF_DBL_TYPE),
          "bcast");
    }
    for (node = 0; node < section_size; node++) {
      global = node + nnode_read;
      RXS(ref_node_local(ref_node, global, &local), REF_NOT_FOUND, "local");
      if (REF_EMPTY != local) {
        for (i = 0; i < *ldim; i++) {
          (*scalar)[i + local * (*ldim)] = data[i + node * (*ldim)];
        }
      }
      if (2 == dim) {
        global = nnode + (REF_GLOB)node + nnode_read;
        RXS(ref_node_local(ref_node, global, &local), REF_NOT_FOUND, "local");
        if (REF_EMPTY != local) {
          for (i = 0; i < *ldim; i++) {
            (*scalar)[i + local * (*ldim)] = data[i + node * (*ldim)];
          }
        }
      }
    }
    nnode_read += (REF_LONG)section_size;
  }

  ref_free(data);

  if (ref_mpi_once(ref_node_mpi(ref_node))) {
    REIS(next_position, ftello(file), "end location");
    REIS(0, fclose(file), "close file");
  }
  return REF_SUCCESS;
}